

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

bool __thiscall
ktxApp::loadFileList
          (ktxApp *this,string *f,bool relativize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  int iVar1;
  FILE *__s;
  undefined8 uVar2;
  int *piVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar5;
  value_type *in_RCX;
  byte in_DL;
  string *in_RSI;
  ktxApp *in_RDI;
  char c;
  string readFilename;
  char *p;
  char buf [4096];
  size_t dirnameEnd;
  string dirname;
  FILE *lf;
  string listName;
  string *in_stack_ffffffffffffee78;
  value_type *__x;
  string *in_stack_ffffffffffffee80;
  value_type *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffeeb0;
  char *in_stack_ffffffffffffeeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string local_1128 [38];
  char local_1102;
  allocator<char> local_1101;
  string local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10e0;
  char local_10d8 [32];
  string local_d0 [32];
  long local_b0;
  string local_a8 [32];
  undefined4 local_88;
  undefined1 local_81 [33];
  FILE *local_60;
  string local_48 [32];
  value_type *local_28;
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  std::__cxx11::string::string(local_48,in_RSI);
  std::__cxx11::string::erase((ulong)local_48,0);
  local_60 = (FILE *)0x0;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0);
  __s = (FILE *)fopenUTF8(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
  local_60 = __s;
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  if (local_60 == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    error(in_RDI,"failed opening filename list: \"%s\": %s\n",uVar2,pcVar4);
    local_1 = 0;
    local_88 = 1;
  }
  else {
    std::__cxx11::string::string(local_a8);
    if ((local_19 & 1) != 0) {
      local_b0 = std::__cxx11::string::find_last_of((char)local_48,0x2f);
      if (local_b0 == -1) {
        local_19 = 0;
      }
      else {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)local_48);
        std::__cxx11::string::operator=(local_a8,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
    }
    while( true ) {
      local_10d8[0] = '\0';
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                fgets(local_10d8,0x1000,local_60);
      local_10e0 = this_00;
      if (this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      break;
      __lhs = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__s,in_stack_ffffffffffffeeb0);
      std::allocator<char>::~allocator(&local_1101);
      while ((lVar5 = std::__cxx11::string::size(), lVar5 != 0 &&
             (in_stack_ffffffffffffee88 =
                   (value_type *)std::__cxx11::string::operator[]((ulong)&local_1100),
             in_stack_ffffffffffffee88->_M_dataplus == (_Alloc_hider)0x20))) {
        std::__cxx11::string::erase((ulong)&local_1100,0);
      }
      while (lVar5 = std::__cxx11::string::size(), lVar5 != 0) {
        pcVar4 = (char *)std::__cxx11::string::back();
        local_1102 = *pcVar4;
        if (((local_1102 != ' ') && (local_1102 != '\n')) && (local_1102 != '\r')) break;
        in_stack_ffffffffffffee80 = &local_1100;
        lVar5 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)in_stack_ffffffffffffee80,lVar5 - 1);
      }
      lVar5 = std::__cxx11::string::size();
      if (lVar5 != 0) {
        if ((local_19 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,in_stack_ffffffffffffee88);
        }
        else {
          __x = local_28;
          std::operator+(__lhs,in_stack_ffffffffffffeea0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffee80,__x);
          std::__cxx11::string::~string(local_1128);
        }
      }
      std::__cxx11::string::~string((string *)&local_1100);
    }
    iVar1 = ferror(local_60);
    if (iVar1 == 0) {
      fclose(local_60);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      error(in_RDI,"failed reading filename list: \"%s\": %s\n",uVar2,pcVar4);
      fclose(local_60);
    }
    local_88 = 1;
    local_1 = iVar1 == 0;
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFileList(const string &f, bool relativize,
                      vector<string>& filenames)
    {
        string listName(f);
        listName.erase(0, relativize ? 2 : 1);

        FILE *lf = nullptr;
        lf = fopenUTF8(listName, "r");
        if (!lf) {
            error("failed opening filename list: \"%s\": %s\n",
                  listName.c_str(), strerror(errno));
            return false;
        }

        string dirname;

        if (relativize) {
            size_t dirnameEnd = listName.find_last_of('/');
            if (dirnameEnd == string::npos) {
                relativize = false;
            } else {
                dirname = listName.substr(0, dirnameEnd + 1);
            }
        }

        for (;;) {
            // Cross platform PATH_MAX def is too much trouble!
            char buf[4096];
            buf[0] = '\0';

            char *p = fgets(buf, sizeof(buf), lf);
            if (!p) {
              if (ferror(lf)) {
                error("failed reading filename list: \"%s\": %s\n",
                      listName.c_str(), strerror(errno));
                fclose(lf);
                return false;
              } else
                break;
            }

            string readFilename(p);
            while (readFilename.size()) {
                if (readFilename[0] == ' ')
                  readFilename.erase(0, 1);
                else
                  break;
            }

            while (readFilename.size()) {
                const char c = readFilename.back();
                if ((c == ' ') || (c == '\n') || (c == '\r'))
                  readFilename.erase(readFilename.size() - 1, 1);
                else
                  break;
            }

            if (readFilename.size()) {
                if (relativize)
                    filenames.push_back(dirname + readFilename);
                else
                    filenames.push_back(readFilename);
            }
        }

        fclose(lf);

        return true;
    }